

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O3

Message __thiscall
testing::internal::UnorderedElementsAreMatcherImplBase::Elements
          (UnorderedElementsAreMatcherImplBase *this,size_t n)

{
  char *pcVar1;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_20;
  
  Message::Message((Message *)&local_20);
  std::ostream::_M_insert<unsigned_long>((ulong)(local_20._M_head_impl + 0x10));
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_20._M_head_impl + 0x10)," element",8);
  pcVar1 = "";
  if (n != 1) {
    pcVar1 = "s";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_20._M_head_impl + 0x10),pcVar1,(ulong)(n != 1));
  Message::Message((Message *)this,(Message *)&local_20);
  if (local_20._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_20._M_head_impl + 8))();
  }
  return (unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )(unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )this;
}

Assistant:

static Message Elements(size_t n) {
    return Message() << n << " element" << (n == 1 ? "" : "s");
  }